

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::TransformedPrimitive::Intersect(TransformedPrimitive *this,Ray *r,Float tMax)

{
  Normal3<float> n2;
  Normal3<float> n1;
  bool bVar1;
  ShapeIntersection *args;
  ShapeIntersection *args_1;
  ShapeIntersection *pSVar2;
  char *in_RSI;
  optional<pbrt::ShapeIntersection> *in_RDI;
  float in_XMM0_Da;
  type tVar3;
  int vb_1;
  type va_1;
  SurfaceInteraction *in_stack_00000120;
  Transform *in_stack_00000128;
  double vb;
  Float va;
  optional<pbrt::ShapeIntersection> si;
  Ray ray;
  SurfaceInteraction *in_stack_fffffffffffffcc8;
  SurfaceInteraction *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  float in_stack_fffffffffffffcdc;
  optional<pbrt::ShapeIntersection> *in_stack_fffffffffffffce0;
  Primitive *in_stack_fffffffffffffce8;
  float fVar4;
  char (*in_stack_fffffffffffffd18) [13];
  optional<pbrt::ShapeIntersection> *poVar5;
  LogLevel level;
  undefined4 in_stack_fffffffffffffd50;
  uint uVar6;
  undefined4 in_stack_fffffffffffffd54;
  float *in_stack_fffffffffffffd58;
  float *args_3;
  undefined4 in_stack_fffffffffffffd60;
  float fVar7;
  undefined4 in_stack_fffffffffffffd64;
  double *in_stack_fffffffffffffd68;
  int *args_5;
  Float *in_stack_fffffffffffffea8;
  Ray *in_stack_fffffffffffffeb0;
  Transform *in_stack_fffffffffffffeb8;
  undefined1 local_48 [44];
  float local_1c;
  
  level = (LogLevel)((ulong)local_48 >> 0x20);
  poVar5 = in_RDI;
  local_1c = in_XMM0_Da;
  Transform::ApplyInverse
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Primitive::Intersect
            (in_stack_fffffffffffffce8,(Ray *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)&stack0xfffffffffffffeb0);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd50);
  if (bVar1) {
    args = pstd::optional<pbrt::ShapeIntersection>::operator->
                     ((optional<pbrt::ShapeIntersection> *)0x86b833);
    if (local_1c * 1.001 <= args->tHit) {
      LogFatal<char_const(&)[9],char_const(&)[13],char_const(&)[9],float&,char_const(&)[13],double&>
                (level,in_RSI,(int)((ulong)poVar5 >> 0x20),(char *)in_RDI,(char (*) [9])args,
                 in_stack_fffffffffffffd18,(char (*) [9])CONCAT44(in_stack_fffffffffffffd54,uVar6),
                 in_stack_fffffffffffffd58,
                 (char (*) [13])CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 in_stack_fffffffffffffd68);
    }
    args_1 = pstd::optional<pbrt::ShapeIntersection>::operator->
                       ((optional<pbrt::ShapeIntersection> *)0x86b8fc);
    Transform::operator()(in_stack_00000128,in_stack_00000120);
    pstd::optional<pbrt::ShapeIntersection>::operator->
              ((optional<pbrt::ShapeIntersection> *)0x86b929);
    SurfaceInteraction::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    pSVar2 = pstd::optional<pbrt::ShapeIntersection>::operator->
                       ((optional<pbrt::ShapeIntersection> *)0x86b953);
    fVar4 = SUB84(pSVar2,0);
    args_5 = *(int **)&(pSVar2->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>;
    pSVar2 = pstd::optional<pbrt::ShapeIntersection>::operator->
                       ((optional<pbrt::ShapeIntersection> *)0x86b982);
    fVar7 = (pSVar2->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
    args_3 = *(float **)&(pSVar2->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>;
    n1.super_Tuple3<pbrt::Normal3,_float>.z = fVar4;
    n1.super_Tuple3<pbrt::Normal3,_float>._0_8_ = pSVar2;
    n2.super_Tuple3<pbrt::Normal3,_float>._4_8_ = in_stack_fffffffffffffce0;
    n2.super_Tuple3<pbrt::Normal3,_float>.x = in_stack_fffffffffffffcdc;
    tVar3 = Dot<float>(n1,n2);
    if (tVar3 < 0.0) {
      LogFatal<char_const(&)[36],char_const(&)[2],char_const(&)[36],float&,char_const(&)[2],int&>
                (level,in_RSI,(int)((ulong)poVar5 >> 0x20),(char *)in_RDI,(char (*) [36])args,
                 (char (*) [2])args_1,(char (*) [36])(ulong)uVar6,args_3,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffd64,fVar7),args_5);
    }
    pstd::optional<pbrt::ShapeIntersection>::optional
              (in_stack_fffffffffffffce0,
               (optional<pbrt::ShapeIntersection> *)
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  }
  else {
    memset(in_RDI,0,0x108);
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional((optional<pbrt::ShapeIntersection> *)0x86bac8);
  return poVar5;
}

Assistant:

pstd::optional<ShapeIntersection> TransformedPrimitive::Intersect(const Ray &r,
                                                                  Float tMax) const {
    // Transform ray to primitive-space and intersect with primitive
    Ray ray = renderFromPrimitive->ApplyInverse(r, &tMax);
    pstd::optional<ShapeIntersection> si = primitive.Intersect(ray, tMax);
    if (!si)
        return {};
    CHECK_LT(si->tHit, 1.001 * tMax);

    // Return transformed instance's intersection information
    si->intr = (*renderFromPrimitive)(si->intr);
    CHECK_GE(Dot(si->intr.n, si->intr.shading.n), 0);
    return si;
}